

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd)

{
  bool bVar1;
  FederateStates FVar2;
  GlobalFederateId GVar3;
  route_id rVar4;
  FederateState *this_00;
  long in_RSI;
  FederateState *in_RDI;
  route_id route;
  optional<helics::ActionMessage> rep;
  FederateState *fed;
  GlobalFederateId dest;
  ActionMessage *in_stack_00000178;
  CommonCore *in_stack_00000180;
  ActionMessage *in_stack_00000368;
  TranslatorFederate *in_stack_00000370;
  ActionMessage *in_stack_00000478;
  FilterFederate *in_stack_00000480;
  ActionMessage *in_stack_fffffffffffffed8;
  CommonCore *in_stack_fffffffffffffef8;
  GlobalFederateId in_stack_ffffffffffffff00;
  CommonCore *in_stack_ffffffffffffff08;
  GlobalFederateId in_stack_ffffffffffffff14;
  CommonCore *in_stack_ffffffffffffff18;
  GlobalFederateId in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffffc0;
  GlobalFederateId local_14;
  long local_10;
  
  local_14.gid = *(BaseType *)(in_RSI + 0x10);
  local_10 = in_RSI;
  bVar1 = GlobalFederateId::operator==(&local_14,(GlobalBrokerId)0x0);
  if ((bVar1) ||
     (bVar1 = GlobalFederateId::operator==
                        (&local_14,(GlobalBrokerId)*(BaseType *)((long)&(in_RDI->name).field_2 + 8))
     , bVar1)) {
    (**(code **)((in_RDI->name)._M_dataplus._M_p + 0x358))(in_RDI,0,local_10);
  }
  else {
    bVar1 = GlobalFederateId::operator==
                      (&local_14,(GlobalBrokerId)*(BaseType *)((long)&(in_RDI->name).field_2 + 4));
    if (bVar1) {
      processCommandsForCore(in_stack_00000180,in_stack_00000178);
    }
    else {
      GVar3 = std::atomic::operator_cast_to_GlobalFederateId
                        ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffed8);
      bVar1 = GlobalFederateId::operator==(&local_14,GVar3);
      if (bVar1) {
        FilterFederate::handleMessage(in_stack_00000480,in_stack_00000478);
      }
      else {
        GVar3 = std::atomic::operator_cast_to_GlobalFederateId
                          ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffed8);
        bVar1 = GlobalFederateId::operator==(&local_14,GVar3);
        if (bVar1) {
          TranslatorFederate::handleMessage(in_stack_00000370,in_stack_00000368);
        }
        else {
          bVar1 = isLocal(in_stack_ffffffffffffff08,in_stack_ffffffffffffff14);
          if (bVar1) {
            GVar3.gid = local_14.gid;
            this_00 = getFederateCore(in_stack_ffffffffffffff18,in_stack_ffffffffffffff24);
            if (this_00 != (FederateState *)0x0) {
              FVar2 = FederateState::getState((FederateState *)0x54c44e);
              if (FVar2 == FINISHED) {
                FederateState::processPostTerminationAction
                          (this_00,(ActionMessage *)CONCAT44(GVar3.gid,in_stack_ffffffffffffffc0));
                bVar1 = std::optional::operator_cast_to_bool
                                  ((optional<helics::ActionMessage> *)0x54c48d);
                if (bVar1) {
                  std::optional<helics::ActionMessage>::operator*
                            ((optional<helics::ActionMessage> *)0x54c49d);
                  routeMessage(in_stack_00000180,in_stack_00000178);
                }
                std::optional<helics::ActionMessage>::~optional
                          ((optional<helics::ActionMessage> *)0x54c4d2);
              }
              else {
                FederateState::addAction(in_RDI,in_stack_fffffffffffffed8);
              }
            }
          }
          else {
            rVar4 = getRoute(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
            (**(code **)((in_RDI->name)._M_dataplus._M_p + 0x358))(in_RDI,rVar4.rid,local_10);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::routeMessage(ActionMessage&& cmd)
{
    const GlobalFederateId dest = cmd.dest_id;
    if ((dest == parent_broker_id) || (dest == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (dest == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (dest == filterFedID) {
        filterFed->handleMessage(cmd);
    } else if (dest == translatorFedID) {
        translatorFed->handleMessage(cmd);
    } else if (isLocal(dest)) {
        auto* fed = getFederateCore(dest);
        if (fed != nullptr) {
            if (fed->getState() != FederateStates::FINISHED) {
                fed->addAction(std::move(cmd));
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(dest);
        transmit(route, cmd);
    }
}